

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

void __thiscall
slang::ast::StructurePattern::serializeTo(StructurePattern *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  Pattern *__n;
  ASTSerializer *in_RSI;
  size_t in_RDI;
  FieldPattern *fp;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> *__range2;
  undefined1 in_stack_00000088 [16];
  span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>
  *in_stack_ffffffffffffff78;
  ASTSerializer *in_stack_ffffffffffffff80;
  ASTSerializer *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  void *local_58;
  __normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
  local_30;
  long local_28;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff88);
  name._M_str = in_stack_ffffffffffffffa0;
  name._M_len = in_RDI;
  ASTSerializer::startArray(in_RSI,name);
  local_28 = in_RDI + 0x20;
  local_30._M_current =
       (FieldPattern *)
       std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff78);
  std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>::end
            ((span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> *)
             in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
    ::operator*(&local_30);
    ASTSerializer::startObject((ASTSerializer *)0x72ee9f);
    in_stack_ffffffffffffff80 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff88);
    not_null<const_slang::ast::FieldSymbol_*>::operator*
              ((not_null<const_slang::ast::FieldSymbol_*> *)0x72eec4);
    ASTSerializer::writeLink
              ((ASTSerializer *)this,(string_view)in_stack_00000088,(Symbol *)serializer);
    in_stack_ffffffffffffff88 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)local_10);
    __n = not_null<const_slang::ast::Pattern_*>::operator*
                    ((not_null<const_slang::ast::Pattern_*> *)0x72ef04);
    ASTSerializer::write
              (in_stack_ffffffffffffff88,(int)in_stack_ffffffffffffffa0,local_58,(size_t)__n);
    ASTSerializer::endObject((ASTSerializer *)0x72ef25);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  ASTSerializer::endArray((ASTSerializer *)0x72ef3e);
  return;
}

Assistant:

void StructurePattern::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("patterns");
    for (auto& fp : patterns) {
        serializer.startObject();
        serializer.writeLink("field", *fp.field);
        serializer.write("pattern", *fp.pattern);
        serializer.endObject();
    }
    serializer.endArray();
}